

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_default_colorspace(j_compress_ptr cinfo)

{
  long *in_RDI;
  j_compress_ptr unaff_retaddr;
  J_COLOR_SPACE colorspace;
  
  colorspace = (J_COLOR_SPACE)((ulong)in_RDI >> 0x20);
  switch(*(undefined4 *)((long)in_RDI + 0x3c)) {
  case 0:
    jpeg_set_colorspace(unaff_retaddr,colorspace);
    break;
  case 1:
    jpeg_set_colorspace(unaff_retaddr,colorspace);
    break;
  case 2:
    jpeg_set_colorspace(unaff_retaddr,colorspace);
    break;
  case 3:
    jpeg_set_colorspace(unaff_retaddr,colorspace);
    break;
  case 4:
    jpeg_set_colorspace(unaff_retaddr,colorspace);
    break;
  case 5:
    jpeg_set_colorspace(unaff_retaddr,colorspace);
    break;
  default:
    *(undefined4 *)(*in_RDI + 0x28) = 10;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_default_colorspace (j_compress_ptr cinfo)
{
  switch (cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);
    break;
  case JCS_RGB:
    jpeg_set_colorspace(cinfo, JCS_YCbCr);
    break;
  case JCS_YCbCr:
    jpeg_set_colorspace(cinfo, JCS_YCbCr);
    break;
  case JCS_CMYK:
    jpeg_set_colorspace(cinfo, JCS_CMYK); /* By default, no translation */
    break;
  case JCS_YCCK:
    jpeg_set_colorspace(cinfo, JCS_YCCK);
    break;
  case JCS_UNKNOWN:
    jpeg_set_colorspace(cinfo, JCS_UNKNOWN);
    break;
  default:
    ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
  }
}